

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimaleglintegration.cpp
# Opt level: O2

QPlatformBackingStore * __thiscall
QMinimalEglIntegration::createPlatformBackingStore(QMinimalEglIntegration *this,QWindow *window)

{
  QMinimalEglBackingStore *this_00;
  
  this_00 = (QMinimalEglBackingStore *)operator_new(0x20);
  QMinimalEglBackingStore::QMinimalEglBackingStore(this_00,window);
  return &this_00->super_QPlatformBackingStore;
}

Assistant:

QPlatformBackingStore *QMinimalEglIntegration::createPlatformBackingStore(QWindow *window) const
{
#ifdef QEGL_EXTRA_DEBUG
    qWarning("QMinimalEglIntegration::createWindowSurface %p\n", window);
#endif
#ifndef QT_NO_OPENGL
    return new QMinimalEglBackingStore(window);
#else
    Q_UNUSED(window);
    return nullptr;
#endif
}